

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseLaneConstValue
          (JSONParser *this,Type lane_type,int lane,ExpectedValue *out_value,string_view value_str,
          AllowExpected allow_expected)

{
  Result RVar1;
  ExpectedNan nan;
  v128 local_58;
  uint32_t value;
  undefined4 uStack_3c;
  Type lane_type_local;
  
  local_58.v._0_8_ = (out_value->value).value.field_0.i64_;
  local_58.v._8_8_ = *(undefined8 *)((long)&(out_value->value).value.field_0 + 8);
  lane_type_local = lane_type;
  switch(lane_type.enum_) {
  case I16:
    RVar1 = ParseI32Value(this,&value,value_str);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    v128::From<unsigned_short>(&local_58,lane,CONCAT11(value._1_1_,(uchar)value));
    break;
  case I8:
    RVar1 = ParseI32Value(this,&value,value_str);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    v128::From<unsigned_char>(&local_58,lane,(uchar)value);
    break;
  default:
    wabt::Type::GetName_abi_cxx11_((string *)&value,&lane_type_local);
    PrintError(this,"unknown concrete type: \"%s\"",
               CONCAT44(uStack_3c,CONCAT22(value._2_2_,CONCAT11(value._1_1_,(uchar)value))));
    std::__cxx11::string::_M_dispose();
    return (Result)Error;
  case F64:
    RVar1 = ParseF64Value(this,(uint64_t *)&value,&nan,value_str,allow_expected);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    v128::From<unsigned_long>
              (&local_58,lane,
               CONCAT44(uStack_3c,CONCAT22(value._2_2_,CONCAT11(value._1_1_,(uchar)value))));
    if (1 < lane) {
      __assert_fail("lane < 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                    ,0x2f1,
                    "wabt::Result spectest::JSONParser::ParseLaneConstValue(Type, int, ExpectedValue *, std::string_view, AllowExpected)"
                   );
    }
    goto LAB_001196e3;
  case F32:
    RVar1 = ParseF32Value(this,&nan,&value,value_str,allow_expected);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    v128::From<unsigned_int>(&local_58,lane,nan);
    if (3 < lane) {
      __assert_fail("lane < 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                    ,0x2e7,
                    "wabt::Result spectest::JSONParser::ParseLaneConstValue(Type, int, ExpectedValue *, std::string_view, AllowExpected)"
                   );
    }
    nan = CONCAT22(value._2_2_,CONCAT11(value._1_1_,(uchar)value));
LAB_001196e3:
    out_value->nan[lane] = nan;
    break;
  case I64:
    RVar1 = ParseI64Value(this,(uint64_t *)&value,value_str);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    v128::From<unsigned_long>
              (&local_58,lane,
               CONCAT44(uStack_3c,CONCAT22(value._2_2_,CONCAT11(value._1_1_,(uchar)value))));
    break;
  case I32:
    RVar1 = ParseI32Value(this,&value,value_str);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    v128::From<unsigned_int>
              (&local_58,lane,CONCAT22(value._2_2_,CONCAT11(value._1_1_,(uchar)value)));
  }
  (out_value->value).value.field_0.i64_ = local_58.v._0_8_;
  *(undefined8 *)((long)&(out_value->value).value.field_0 + 8) = local_58.v._8_8_;
  return (Result)Ok;
}

Assistant:

wabt::Result JSONParser::ParseLaneConstValue(Type lane_type,
                                             int lane,
                                             ExpectedValue* out_value,
                                             std::string_view value_str,
                                             AllowExpected allow_expected) {
  v128 v = out_value->value.value.Get<v128>();

  switch (lane_type) {
    case Type::I8: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u8(lane, value);
      break;
    }

    case Type::I16: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u16(lane, value);
      break;
    }

    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u32(lane, value);
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      v.set_u64(lane, value);
      break;
    }

    case Type::F32: {
      ExpectedNan nan;
      uint32_t value_bits;
      CHECK_RESULT(ParseF32Value(&value_bits, &nan, value_str, allow_expected));
      v.set_f32_bits(lane, value_bits);
      assert(lane < 4);
      out_value->nan[lane] = nan;
      break;
    }

    case Type::F64: {
      ExpectedNan nan;
      uint64_t value_bits;
      CHECK_RESULT(ParseF64Value(&value_bits, &nan, value_str, allow_expected));
      v.set_f64_bits(lane, value_bits);
      assert(lane < 2);
      out_value->nan[lane] = nan;
      break;
    }

    default:
      PrintError("unknown concrete type: \"%s\"", lane_type.GetName().c_str());
      return wabt::Result::Error;
  }

  out_value->value.value.Set<v128>(v);
  return wabt::Result::Ok;
}